

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

void __thiscall
cmFindPathCommand::cmFindPathCommand(cmFindPathCommand *this,cmExecutionStatus *status)

{
  allocator<char> local_39;
  string local_38;
  cmExecutionStatus *local_18;
  cmExecutionStatus *status_local;
  cmFindPathCommand *this_local;
  
  local_18 = status;
  status_local = (cmExecutionStatus *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"find_path",&local_39);
  cmFindPathCommand(this,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

cmFindPathCommand::cmFindPathCommand(cmExecutionStatus& status)
  : cmFindPathCommand("find_path", status)
{
}